

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::ListFileScope::~ListFileScope(ListFileScope *this)

{
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_20;
  ListFileScope *local_10;
  ListFileScope *this_local;
  
  local_10 = this;
  PopSnapshot(this->Makefile,(bool)(this->ReportError & 1));
  PopFunctionBlockerBarrier(this->Makefile,(bool)(this->ReportError & 1));
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Pop(&local_20);
  cmListFileBacktrace::operator=(&this->Makefile->Backtrace,(cmListFileBacktrace *)&local_20);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_20);
  return;
}

Assistant:

~ListFileScope()
  {
    this->Makefile->PopSnapshot(this->ReportError);
    this->Makefile->PopFunctionBlockerBarrier(this->ReportError);
    this->Makefile->Backtrace = this->Makefile->Backtrace.Pop();
  }